

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptArray::BigIndex::SetItem
          (BigIndex *this,RecyclableObject *obj,Var newValue,PropertyOperationFlags flags)

{
  ScriptContext *scriptContext;
  BOOL BVar1;
  ScriptContext *requestContext;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  
  scriptContext =
       (((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  if (this->index == 0xffffffff) {
    JavascriptOperators::GetPropertyIdForInt(this->bigIndex,scriptContext,&local_38);
    BVar1 = JavascriptOperators::SetProperty(obj,obj,local_38->pid,newValue,scriptContext,flags);
  }
  else {
    BVar1 = JavascriptOperators::SetItem(obj,obj,this->index,newValue,scriptContext,flags,0);
  }
  return BVar1;
}

Assistant:

BOOL JavascriptArray::BigIndex::SetItem(RecyclableObject* obj, Var newValue, PropertyOperationFlags flags) const
    {
        if (IsSmallIndex())
        {
            return small_index::SetItem(obj, index, newValue, flags);
        }
        else
        {
            ScriptContext* scriptContext = obj->GetScriptContext();
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, scriptContext, &propertyRecord);
            return JavascriptOperators::SetProperty(obj, obj, propertyRecord->GetPropertyId(), newValue, scriptContext, flags);
        }
    }